

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader * __thiscall
capnp::DynamicValue::Builder::asReader(Reader *__return_storage_ptr__,Builder *this)

{
  undefined8 uVar1;
  DynamicEnum value;
  Fault local_f0;
  Fault f;
  Reader local_c8;
  int64_t local_90;
  undefined2 local_88;
  undefined6 uStack_86;
  Reader local_80;
  ArrayPtr<const_unsigned_char> local_40;
  StringPtr local_30;
  Builder *local_18;
  Builder *this_local;
  
  local_18 = this;
  this_local = (Builder *)__return_storage_ptr__;
  switch(this->type) {
  case UNKNOWN:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(void *)0x0);
    break;
  case VOID:
    DynamicValue::Reader::Reader(__return_storage_ptr__);
    break;
  case BOOL:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(bool)((this->field_1).field12[0] & 1));
    break;
  case INT:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(this->field_1).intValue);
    break;
  case UINT:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(this->field_1).uintValue);
    break;
  case FLOAT:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(this->field_1).floatValue);
    break;
  case TEXT:
    local_30.content = (ArrayPtr<const_char>)Text::Builder::asReader(&(this->field_1).textValue);
    DynamicValue::Reader::Reader(__return_storage_ptr__,(Reader *)&local_30);
    break;
  case DATA:
    local_40 = (ArrayPtr<const_unsigned_char>)Data::Builder::asReader(&(this->field_1).dataValue);
    DynamicValue::Reader::Reader(__return_storage_ptr__,(Reader *)&local_40);
    break;
  case LIST:
    DynamicList::Builder::asReader(&local_80,&(this->field_1).listValue);
    DynamicValue::Reader::Reader(__return_storage_ptr__,&local_80);
    break;
  case ENUM:
    local_90 = (this->field_1).intValue;
    uVar1 = *(undefined8 *)((long)&this->field_1 + 8);
    local_88 = (undefined2)uVar1;
    uStack_86 = (undefined6)((ulong)uVar1 >> 0x10);
    value._10_6_ = 0;
    value._0_10_ = *(unkuint10 *)&this->field_1;
    DynamicValue::Reader::Reader(__return_storage_ptr__,value);
    break;
  case STRUCT:
    DynamicStruct::Builder::asReader(&local_c8,&(this->field_1).structValue);
    DynamicValue::Reader::Reader(__return_storage_ptr__,&local_c8);
    break;
  case CAPABILITY:
    DynamicValue::Reader::Reader(__return_storage_ptr__,&(this->field_1).capabilityValue);
    break;
  case ANY_POINTER:
    AnyPointer::Builder::asReader((Reader *)&f,&(this->field_1).anyPointerValue);
    DynamicValue::Reader::Reader(__return_storage_ptr__,(Reader *)&f);
    break;
  default:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x682,FAILED,(char *)0x0,"\"Missing switch case.\"",
               (char (*) [21])"Missing switch case.");
    kj::_::Debug::Fault::fatal(&local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader DynamicValue::Builder::asReader() const {
  switch (type) {
    case UNKNOWN: return Reader();
    case VOID: return Reader(voidValue);
    case BOOL: return Reader(boolValue);
    case INT: return Reader(intValue);
    case UINT: return Reader(uintValue);
    case FLOAT: return Reader(floatValue);
    case TEXT: return Reader(textValue.asReader());
    case DATA: return Reader(dataValue.asReader());
    case LIST: return Reader(listValue.asReader());
    case ENUM: return Reader(enumValue);
    case STRUCT: return Reader(structValue.asReader());
    case CAPABILITY: return Reader(capabilityValue);
    case ANY_POINTER: return Reader(anyPointerValue.asReader());
  }
  KJ_FAIL_ASSERT("Missing switch case.");
  return Reader();
}